

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O1

int32_t icu_63::CollationRuleParser::getReorderCode(char *word)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  iVar2 = uprv_stricmp_63(word,"space");
  if (iVar2 == 0) {
    uVar3 = 0x1000;
    bVar5 = false;
  }
  else {
    uVar1 = 0;
    do {
      uVar4 = uVar1;
      bVar5 = 3 < uVar4;
      if (uVar4 == 4) {
        uVar3 = 4;
        goto LAB_002402ca;
      }
      iVar2 = uprv_stricmp_63(word,_ZN6icu_63L20gSpecialReorderCodesE_rel +
                                   *(int *)(_ZN6icu_63L20gSpecialReorderCodesE_rel + uVar4 * 4 + 4))
      ;
      uVar1 = uVar4 + 1;
    } while (iVar2 != 0);
    bVar5 = 3 < uVar4;
    uVar3 = (int)(uVar4 + 1) + 0x1000;
  }
LAB_002402ca:
  if (bVar5) {
    uVar3 = u_getPropertyValueEnum_63(UCHAR_SCRIPT,word);
    if ((int)uVar3 < 0) {
      iVar2 = uprv_stricmp_63(word,"others");
      uVar3 = -(uint)(iVar2 != 0) | 0x67;
    }
  }
  return uVar3;
}

Assistant:

int32_t
CollationRuleParser::getReorderCode(const char *word) {
    for(int32_t i = 0; i < UPRV_LENGTHOF(gSpecialReorderCodes); ++i) {
        if(uprv_stricmp(word, gSpecialReorderCodes[i]) == 0) {
            return UCOL_REORDER_CODE_FIRST + i;
        }
    }
    int32_t script = u_getPropertyValueEnum(UCHAR_SCRIPT, word);
    if(script >= 0) {
        return script;
    }
    if(uprv_stricmp(word, "others") == 0) {
        return UCOL_REORDER_CODE_OTHERS;  // same as Zzzz = USCRIPT_UNKNOWN
    }
    return -1;
}